

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_record_validate(coda_type_record *type)

{
  char *message;
  
  if (type == (coda_type_record *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x5f7);
  }
  else {
    if (type->is_union == 0) {
      return 0;
    }
    if (type->num_fields == 0) {
      message = "number of fields should be >= 1 for union type";
    }
    else {
      if (coda_format_binary < type->format) {
        return 0;
      }
      if (type->union_field_expr != (coda_expression *)0x0) {
        return 0;
      }
      message = "missing union field expression";
    }
    coda_set_error(-400,message);
  }
  return -1;
}

Assistant:

int coda_type_record_validate(const coda_type_record *type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->is_union)
    {
        if (type->num_fields == 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "number of fields should be >= 1 for union type");
            return -1;
        }
        if (type->format == coda_format_ascii || type->format == coda_format_binary)
        {
            if (type->union_field_expr == NULL)
            {
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "missing union field expression");
                return -1;
            }
        }
    }
    return 0;
}